

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * __thiscall
pfederc::Lexer::getLineFromIndex_abi_cxx11_(string *__return_storage_ptr__,Lexer *this,size_t index)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->currentEndIndex < index) {
    std::__cxx11::to_string(&local_50,index);
    std::operator+(&local_30,"Out of bounds: ",&local_50);
    fatal("lexer.cpp",0x1c,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_30);
  }
  else {
    getLineNumber(this,index);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->fileContent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getLineFromIndex(size_t index) const noexcept {
  if (index > currentEndIndex) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(index));
    return "";
  }

  size_t lineIndex = getLineNumber(index);

  size_t lineStartIndex = lineIndices[lineIndex];
  size_t lineEndIndex = lineIndex == lineIndices.size() - 1
    ? currentEndIndex : lineIndices[lineIndex + 1] - 1;
  if (lineEndIndex > lineStartIndex
        && (fileContent[lineEndIndex] == '\r'
          || fileContent[lineEndIndex] == '\n')) {
    --lineEndIndex;
  }

  std::string result(fileContent.substr(lineStartIndex,
    lineEndIndex - lineStartIndex));
  return result;
}